

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Liby::Buffer::append(Buffer *this,char *buf,off_t len)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *__dest;
  long __tmp_1;
  long minSize;
  char *__tmp;
  
  if ((buf != (char *)0x0) && (0 < len)) {
    lVar1 = this->leftIndex_;
    lVar2 = this->rightIndex_;
    if (lVar1 == lVar2) {
      __dest = (char *)operator_new__(len);
      memcpy(__dest,buf,len);
      pcVar3 = this->buffer_;
      this->buffer_ = __dest;
      this->leftIndex_ = 0;
      this->rightIndex_ = len;
      this->capacity_ = len;
      if (pcVar3 != (char *)0x0) {
        operator_delete__(pcVar3);
        return;
      }
    }
    else {
      minSize = this->capacity_;
      if (minSize - lVar2 < len) {
        if (lVar2 < lVar1) {
          __assert_fail("rightIndex_ >= leftIndex_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                        ,0x5a,"off_t Liby::Buffer::size() const");
        }
        if (minSize < (len - lVar1) + lVar2) {
          if (minSize <= lVar2 + len) {
            do {
              minSize = minSize * 2;
            } while (minSize < lVar2 + len);
            resize(this,minSize);
          }
        }
        else {
          forward(this,0);
        }
      }
      memcpy(this->buffer_ + this->rightIndex_,buf,len);
      this->rightIndex_ = this->rightIndex_ + len;
    }
    return;
  }
  __assert_fail("buf && len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                ,0x6e,"void Liby::Buffer::append(const char *, off_t)");
}

Assistant:

void Buffer::append(const char *buf, off_t len) {
    assert(buf && len > 0);
    if(empty()) {
        Buffer buffer(buf, len);
        swap(buffer);
        return;
    }
    if (capacity_ - rightIndex_ >= len) {
        ;
    } else if (len + size() <= capacity_) {
        forward();
    } else {
        off_t minSize = size() + len + leftIndex_;
        reserve(minSize);
    }
    safeAppend(buf, len);
}